

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

void __thiscall
spirv_cross::Compiler::analyze_variable_scope
          (Compiler *this,SPIRFunction *entry,AnalyzeVariableScopeAccessHandler *handler)

{
  type pCVar1;
  bool bVar2;
  bool bVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  pointer ppVar6;
  size_type *this_00;
  TypedID<(spirv_cross::Types)6> *pTVar7;
  SPIRBlock *pSVar8;
  pointer ppVar9;
  size_type *psVar10;
  reference __k;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)2>,_8UL> *this_01;
  pointer ppVar11;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *puVar12;
  TypedID *pTVar13;
  mapped_type *pmVar14;
  reference __k_00;
  mapped_type *pmVar15;
  size_type sVar16;
  size_t sVar17;
  uint *puVar18;
  TypedID<(spirv_cross::Types)2> *pTVar19;
  TypedID<(spirv_cross::Types)2> *pTVar20;
  SPIRVariable *pSVar21;
  bool bVar22;
  TypedID<(spirv_cross::Types)2> local_324;
  anon_class_16_2_2fc8764d local_320;
  TypedID<(spirv_cross::Types)6> local_30c;
  SmallVector<unsigned_int,_8UL> *local_308;
  SmallVector<unsigned_int,_8UL> *pred;
  SmallVector<unsigned_int,_8UL> *succ;
  uint32_t local_2f0;
  bool static_loop_init;
  mapped_type *pmStack_2e8;
  bool has_accessed_variable;
  mapped_type *blocks_2;
  SPIRBlock *header_block;
  _Node_iterator_base<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)6>,_spirv_cross::TypedID<(spirv_cross::Types)6>_>,_true>
  local_2d0;
  iterator itr_2;
  BlockID header;
  TypedID<(spirv_cross::Types)6> local_2bc;
  TypedID<(spirv_cross::Types)6> local_2b8;
  uint32_t local_2b4;
  BlockID block_5;
  BlockID dominator;
  SPIRVariable *var_2;
  pair<const_unsigned_int,_unsigned_int> *loop_variable;
  iterator __end1_3;
  iterator __begin1_3;
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  *__range1_3;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  seen_blocks;
  SmallVector<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>,_8UL>
  *block_temporaries_1;
  SmallVector<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>,_8UL>
  *block_temporaries;
  SPIRBlock *loop_header_block_1;
  uint32_t local_210;
  bool first_use_is_dominator;
  uint32_t dominating_block_1;
  SPIRBlock *loop_header_block;
  uint *block_4;
  iterator __end2_1;
  iterator __begin2_1;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *__range2_1;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *blocks_1;
  undefined1 local_1d0 [6];
  bool used_in_header_hoisted_continue_block;
  bool force_temporary;
  DominatorBuilder builder_1;
  SPIRType *type_1;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_1b0;
  iterator itr_1;
  pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>
  *var_1;
  iterator __end1_2;
  iterator __begin1_2;
  unordered_map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
  *__range1_2;
  SPIRBlock *local_180;
  SPIRBlock *block_3;
  TypedID<(spirv_cross::Types)6> local_170;
  undefined1 local_169;
  SPIRBlock *pSStack_168;
  bool preserve;
  SPIRBlock *block_2;
  SPIRVariable *variable;
  SPIRBlock *pSStack_150;
  BlockID merge_candidate;
  SPIRBlock *inner_block;
  BlockID dominating_block;
  TypedID<(spirv_cross::Types)6> local_13c;
  uint32_t *local_138;
  uint *block_1;
  iterator __end2;
  iterator __begin2;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *__range2;
  SPIRType *pSStack_110;
  BlockID potential_continue_block;
  SPIRType *type;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *blocks;
  DominatorBuilder builder;
  pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>
  *var;
  iterator __end1_1;
  iterator __begin1_1;
  unordered_map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
  *__range1_1;
  TypedID<(spirv_cross::Types)6> local_c0;
  uint32_t local_bc;
  _Node_iterator_base<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)6>,_spirv_cross::TypedID<(spirv_cross::Types)6>_>,_true>
  _Stack_b8;
  uint32_t loop_dominator;
  _Node_iterator_base<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)6>,_spirv_cross::TypedID<(spirv_cross::Types)6>_>,_true>
  local_b0;
  iterator itr;
  SPIRBlock *block;
  TypedID<(spirv_cross::Types)6> *block_id;
  TypedID<(spirv_cross::Types)6> *__end1;
  TypedID<(spirv_cross::Types)6> *__begin1;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)6>,_8UL> *__range1;
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  potential_loop_variables;
  _Node_iterator_base<std::pair<const_unsigned_int,_std::unique_ptr<spirv_cross::CFG,_std::default_delete<spirv_cross::CFG>_>_>,_false>
  local_30;
  type local_28;
  CFG *cfg;
  AnalyzeVariableScopeAccessHandler *handler_local;
  SPIRFunction *entry_local;
  Compiler *this_local;
  
  cfg = (CFG *)handler;
  handler_local = (AnalyzeVariableScopeAccessHandler *)entry;
  entry_local = (SPIRFunction *)this;
  traverse_all_reachable_opcodes(this,entry,&handler->super_OpcodeHandler);
  potential_loop_variables._M_h._M_single_bucket._4_4_ =
       TypedID::operator_cast_to_unsigned_int((TypedID *)&handler_local->compiler);
  local_30._M_cur =
       (__node_type *)
       ::std::
       unordered_map<unsigned_int,_std::unique_ptr<spirv_cross::CFG,_std::default_delete<spirv_cross::CFG>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unique_ptr<spirv_cross::CFG,_std::default_delete<spirv_cross::CFG>_>_>_>_>
       ::find(&this->function_cfgs,
              (key_type *)((long)&potential_loop_variables._M_h._M_single_bucket + 4));
  ppVar6 = ::std::__detail::
           _Node_iterator<std::pair<const_unsigned_int,_std::unique_ptr<spirv_cross::CFG,_std::default_delete<spirv_cross::CFG>_>_>,_false,_false>
           ::operator->((_Node_iterator<std::pair<const_unsigned_int,_std::unique_ptr<spirv_cross::CFG,_std::default_delete<spirv_cross::CFG>_>_>,_false,_false>
                         *)&local_30);
  local_28 = ::std::unique_ptr<spirv_cross::CFG,_std::default_delete<spirv_cross::CFG>_>::operator*
                       (&ppVar6->second);
  analyze_parameter_preservation
            (this,(SPIRFunction *)handler_local,local_28,
             (unordered_map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
              *)&(cfg->preceding_edges)._M_h._M_bucket_count,
             (unordered_map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
              *)&(cfg->visit_order)._M_h._M_bucket_count);
  ::std::
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  ::unordered_map((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                   *)&__range1);
  this_00 = &handler_local[1].accessed_variables_to_block._M_h._M_bucket_count;
  __end1 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)6>_>::begin
                     ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)6>_> *)this_00);
  pTVar7 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)6>_>::end
                     ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)6>_> *)this_00);
  for (; __end1 != pTVar7; __end1 = __end1 + 1) {
    uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)__end1);
    pSVar8 = get<spirv_cross::SPIRBlock>(this,uVar4);
    local_b0._M_cur =
         (__node_type *)
         ::std::
         unordered_map<spirv_cross::TypedID<(spirv_cross::Types)6>,_spirv_cross::TypedID<(spirv_cross::Types)6>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)6>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)6>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)6>,_spirv_cross::TypedID<(spirv_cross::Types)6>_>_>_>
         ::find(&(this->ir).continue_block_to_loop_header,__end1);
    _Stack_b8._M_cur =
         (__node_type *)
         ::std::
         end<std::unordered_map<spirv_cross::TypedID<(spirv_cross::Types)6>,spirv_cross::TypedID<(spirv_cross::Types)6>,std::hash<spirv_cross::TypedID<(spirv_cross::Types)6>>,std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)6>>,std::allocator<std::pair<spirv_cross::TypedID<(spirv_cross::Types)6>const,spirv_cross::TypedID<(spirv_cross::Types)6>>>>>
                   (&(this->ir).continue_block_to_loop_header);
    bVar2 = ::std::__detail::operator!=(&local_b0,&stack0xffffffffffffff48);
    bVar22 = false;
    if (bVar2) {
      ppVar9 = ::std::__detail::
               _Node_iterator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)6>,_spirv_cross::TypedID<(spirv_cross::Types)6>_>,_false,_true>
               ::operator->((_Node_iterator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)6>,_spirv_cross::TypedID<(spirv_cross::Types)6>_>,_false,_true>
                             *)&local_b0);
      uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&ppVar9->second);
      uVar5 = TypedID::operator_cast_to_unsigned_int((TypedID *)__end1);
      bVar22 = uVar4 != uVar5;
    }
    pCVar1 = local_28;
    if (bVar22) {
      ppVar9 = ::std::__detail::
               _Node_iterator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)6>,_spirv_cross::TypedID<(spirv_cross::Types)6>_>,_false,_true>
               ::operator->((_Node_iterator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)6>,_spirv_cross::TypedID<(spirv_cross::Types)6>_>,_false,_true>
                             *)&local_b0);
      (pSVar8->loop_dominator).id = (ppVar9->second).id;
    }
    else {
      uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)__end1);
      uVar4 = CFG::find_loop_dominator(pCVar1,uVar4);
      local_bc = uVar4;
      uVar5 = TypedID::operator_cast_to_unsigned_int((TypedID *)__end1);
      if (uVar4 == uVar5) {
        TypedID<(spirv_cross::Types)6>::TypedID
                  ((TypedID<(spirv_cross::Types)6> *)((long)&__range1_1 + 4),0xffffffff);
        (pSVar8->loop_dominator).id = __range1_1._4_4_;
      }
      else {
        TypedID<(spirv_cross::Types)6>::TypedID(&local_c0,local_bc);
        (pSVar8->loop_dominator).id = local_c0.id;
      }
    }
  }
  psVar10 = &(cfg->preceding_edges)._M_h._M_bucket_count;
  __end1_1 = ::std::
             unordered_map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
             ::begin((unordered_map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
                      *)psVar10);
  var = (pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>
         *)::std::
           unordered_map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
           ::end((unordered_map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
                  *)psVar10);
  do {
    bVar22 = ::std::__detail::operator!=
                       (&__end1_1.
                         super__Node_iterator_base<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>,_false>
                        ,(_Node_iterator_base<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>,_false>
                          *)&var);
    if (!bVar22) {
      psVar10 = &(cfg->succeeding_edges)._M_h._M_bucket_count;
      __end1_2 = ::std::
                 unordered_map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
                 ::begin((unordered_map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
                          *)psVar10);
      var_1 = (pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>
               *)::std::
                 unordered_map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
                 ::end((unordered_map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
                        *)psVar10);
      while (bVar22 = ::std::__detail::operator!=
                                (&__end1_2.
                                  super__Node_iterator_base<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>,_false>
                                 ,(_Node_iterator_base<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>,_false>
                                   *)&var_1), bVar22) {
        itr_1.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur =
             (_Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>)
             ::std::__detail::
             _Node_iterator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>,_false,_false>
             ::operator*(&__end1_2);
        local_1b0._M_cur =
             (__node_type *)
             ::std::
             unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
             ::find((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                     *)&(cfg->immediate_dominators)._M_h._M_bucket_count,
                    (key_type *)
                    itr_1.
                    super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
                    _M_cur);
        type_1 = (SPIRType *)
                 ::std::
                 end<std::unordered_map<unsigned_int,unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>>
                           ((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                             *)&(cfg->immediate_dominators)._M_h._M_bucket_count);
        bVar22 = ::std::__detail::operator==
                           (&local_1b0,
                            (_Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                             *)&type_1);
        if (!bVar22) {
          ppVar11 = ::std::__detail::
                    _Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>::
                    operator->((_Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>
                                *)&local_1b0);
          builder_1._8_8_ = get<spirv_cross::SPIRType>(this,ppVar11->second);
          bVar22 = type_is_opaque_value(this,(SPIRType *)builder_1._8_8_);
          if (!bVar22) {
            DominatorBuilder::DominatorBuilder((DominatorBuilder *)local_1d0,local_28);
            bVar22 = false;
            bVar2 = false;
            puVar12 = (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                       *)((long)itr_1.
                                super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                                ._M_cur + 8);
            __end2_1 = ::std::
                       unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                       ::begin(puVar12);
            block_4 = (uint *)::std::
                              unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                              ::end(puVar12);
            while (bVar3 = ::std::__detail::operator!=
                                     (&__end2_1.super__Node_iterator_base<unsigned_int,_false>,
                                      (_Node_iterator_base<unsigned_int,_false> *)&block_4), bVar3)
            {
              loop_header_block =
                   (SPIRBlock *)
                   ::std::__detail::_Node_iterator<unsigned_int,_true,_false>::operator*(&__end2_1);
              DominatorBuilder::add_block
                        ((DominatorBuilder *)local_1d0,
                         *(uint32_t *)&(loop_header_block->super_IVariant)._vptr_IVariant);
              sVar16 = ::std::
                       unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                       ::size(puVar12);
              if ((sVar16 != 1) &&
                 (bVar3 = is_continue(this,*(uint32_t *)
                                            &(loop_header_block->super_IVariant)._vptr_IVariant),
                 bVar3)) {
                TypedID<(spirv_cross::Types)6>::TypedID
                          ((TypedID<(spirv_cross::Types)6> *)&stack0xfffffffffffffdf4,
                           *(uint32_t *)&(loop_header_block->super_IVariant)._vptr_IVariant);
                pTVar13 = (TypedID *)
                          ::std::
                          unordered_map<spirv_cross::TypedID<(spirv_cross::Types)6>,_spirv_cross::TypedID<(spirv_cross::Types)6>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)6>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)6>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)6>,_spirv_cross::TypedID<(spirv_cross::Types)6>_>_>_>
                          ::operator[](&(this->ir).continue_block_to_loop_header,
                                       (key_type *)&stack0xfffffffffffffdf4);
                uVar4 = TypedID::operator_cast_to_unsigned_int(pTVar13);
                _dominating_block_1 = get<spirv_cross::SPIRBlock>(this,uVar4);
                if (_dominating_block_1->merge != MergeLoop) {
                  __assert_fail("loop_header_block.merge == SPIRBlock::MergeLoop",
                                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]SPIRV-Cross/spirv_cross.cpp"
                                ,0x101e,
                                "void spirv_cross::Compiler::analyze_variable_scope(SPIRFunction &, AnalyzeVariableScopeAccessHandler &)"
                               );
                }
                uVar4 = TypedID::operator_cast_to_unsigned_int
                                  ((TypedID *)&(_dominating_block_1->super_IVariant).self);
                DominatorBuilder::add_block((DominatorBuilder *)local_1d0,uVar4);
                bVar2 = true;
              }
              ::std::__detail::_Node_iterator<unsigned_int,_true,_false>::operator++(&__end2_1);
            }
            local_210 = DominatorBuilder::get_dominator((DominatorBuilder *)local_1d0);
            sVar16 = ::std::
                     unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                     ::size(puVar12);
            if ((sVar16 != 1) && (bVar3 = is_single_block_loop(this,local_210), bVar3)) {
              bVar22 = true;
            }
            if (local_210 != 0) {
              sVar16 = ::std::
                       unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                       ::count(puVar12,&local_210);
              if ((sVar16 == 0) || (bVar22)) {
                sVar16 = ::std::
                         unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                         ::count((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                                  *)&(cfg->empty_vector).super_VectorView<unsigned_int>.buffer_size,
                                 (key_type *)
                                 itr_1.
                                 super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                                 ._M_cur);
                if (sVar16 == 0) {
                  ::std::
                  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                  ::insert(&this->hoisted_temporaries,
                           (value_type *)
                           itr_1.
                           super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                           ._M_cur);
                  ::std::
                  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                  ::insert(&this->forced_temporaries,
                           (value_type *)
                           itr_1.
                           super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                           ._M_cur);
                  pSVar8 = get<spirv_cross::SPIRBlock>(this,local_210);
                  pmVar14 = ::std::
                            unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                            ::operator[]((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                          *)&(cfg->immediate_dominators)._M_h._M_bucket_count,
                                         (key_type *)
                                         itr_1.
                                         super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                                         ._M_cur);
                  SmallVector<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,spirv_cross::TypedID<(spirv_cross::Types)0>>,8ul>
                  ::emplace_back<unsigned_int&,unsigned_int_const&>
                            ((SmallVector<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,spirv_cross::TypedID<(spirv_cross::Types)0>>,8ul>
                              *)&pSVar8->declare_temporary,pmVar14,
                             (uint *)itr_1.
                                     super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                                     ._M_cur);
                }
                else if (bVar2) {
                  pSVar8 = get<spirv_cross::SPIRBlock>(this,local_210);
                  if (pSVar8->merge != MergeLoop) {
                    __assert_fail("loop_header_block.merge == SPIRBlock::MergeLoop",
                                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]SPIRV-Cross/spirv_cross.cpp"
                                  ,0x1046,
                                  "void spirv_cross::Compiler::analyze_variable_scope(SPIRFunction &, AnalyzeVariableScopeAccessHandler &)"
                                 );
                  }
                  pSVar8->complex_continue = true;
                }
              }
              else {
                sVar16 = ::std::
                         unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                         ::size(puVar12);
                if (1 < sVar16) {
                  pSVar8 = get<spirv_cross::SPIRBlock>(this,local_210);
                  seen_blocks._M_h._M_single_bucket =
                       (__node_base_ptr)&pSVar8->potential_declare_temporary;
                  pmVar14 = ::std::
                            unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                            ::operator[]((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                          *)&(cfg->immediate_dominators)._M_h._M_bucket_count,
                                         (key_type *)
                                         itr_1.
                                         super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                                         ._M_cur);
                  SmallVector<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,spirv_cross::TypedID<(spirv_cross::Types)0>>,8ul>
                  ::emplace_back<unsigned_int&,unsigned_int_const&>
                            ((SmallVector<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,spirv_cross::TypedID<(spirv_cross::Types)0>>,8ul>
                              *)&pSVar8->potential_declare_temporary,pmVar14,
                             (uint *)itr_1.
                                     super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                                     ._M_cur);
                }
              }
            }
          }
        }
        ::std::__detail::
        _Node_iterator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>,_false,_false>
        ::operator++(&__end1_2);
      }
      ::std::
      unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
      ::unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                       *)&__range1_3);
      __end1_3 = ::std::
                 unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                 ::begin((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                          *)&__range1);
      loop_variable =
           (pair<const_unsigned_int,_unsigned_int> *)
           ::std::
           unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
           ::end((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                  *)&__range1);
      do {
        bVar22 = ::std::__detail::operator!=
                           (&__end1_3.
                             super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                            ,(_Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                              *)&loop_variable);
        if (!bVar22) {
          ::std::
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          ::~unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                            *)&__range1_3);
          ::std::
          unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
          ::~unordered_map((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                            *)&__range1);
          return;
        }
        __k_00 = ::std::__detail::
                 _Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>::
                 operator*(&__end1_3);
        _block_5 = get<spirv_cross::SPIRVariable>(this,__k_00->first);
        local_2b4 = (_block_5->dominator).id;
        TypedID<(spirv_cross::Types)6>::TypedID(&local_2b8,__k_00->second);
        uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_2b8);
        TypedID<(spirv_cross::Types)6>::TypedID(&local_2bc,0xffffffff);
        uVar5 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_2bc);
        bVar22 = true;
        if (uVar4 != uVar5) {
          uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_2b8);
          TypedID<(spirv_cross::Types)6>::TypedID(&header,0);
          uVar5 = TypedID::operator_cast_to_unsigned_int((TypedID *)&header);
          bVar22 = uVar4 == uVar5;
        }
        if (!bVar22) {
          uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_2b4);
          TypedID<(spirv_cross::Types)0>::TypedID
                    ((TypedID<(spirv_cross::Types)0> *)
                     ((long)&itr_2.
                             super__Node_iterator_base<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)6>,_spirv_cross::TypedID<(spirv_cross::Types)6>_>,_true>
                             ._M_cur + 4),0);
          uVar5 = TypedID::operator_cast_to_unsigned_int
                            ((TypedID *)
                             ((long)&itr_2.
                                     super__Node_iterator_base<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)6>,_spirv_cross::TypedID<(spirv_cross::Types)6>_>,_true>
                                     ._M_cur + 4));
          if (uVar4 != uVar5) {
            TypedID<(spirv_cross::Types)6>::TypedID((TypedID<(spirv_cross::Types)6> *)&itr_2,0);
            local_2d0._M_cur =
                 (__node_type *)
                 ::std::
                 unordered_map<spirv_cross::TypedID<(spirv_cross::Types)6>,_spirv_cross::TypedID<(spirv_cross::Types)6>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)6>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)6>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)6>,_spirv_cross::TypedID<(spirv_cross::Types)6>_>_>_>
                 ::find(&(this->ir).continue_block_to_loop_header,&local_2b8);
            header_block = (SPIRBlock *)
                           ::std::
                           end<std::unordered_map<spirv_cross::TypedID<(spirv_cross::Types)6>,spirv_cross::TypedID<(spirv_cross::Types)6>,std::hash<spirv_cross::TypedID<(spirv_cross::Types)6>>,std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)6>>,std::allocator<std::pair<spirv_cross::TypedID<(spirv_cross::Types)6>const,spirv_cross::TypedID<(spirv_cross::Types)6>>>>>
                                     (&(this->ir).continue_block_to_loop_header);
            bVar22 = ::std::__detail::operator!=
                               (&local_2d0,
                                (_Node_iterator_base<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)6>,_spirv_cross::TypedID<(spirv_cross::Types)6>_>,_true>
                                 *)&header_block);
            if (bVar22) {
              ppVar9 = ::std::__detail::
                       _Node_iterator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)6>,_spirv_cross::TypedID<(spirv_cross::Types)6>_>,_false,_true>
                       ::operator->((_Node_iterator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)6>,_spirv_cross::TypedID<(spirv_cross::Types)6>_>,_false,_true>
                                     *)&local_2d0);
              itr_2.
              super__Node_iterator_base<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)6>,_spirv_cross::TypedID<(spirv_cross::Types)6>_>,_true>
              ._M_cur._0_4_ = (ppVar9->second).id;
            }
            else {
              uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_2b8);
              pSVar8 = get<spirv_cross::SPIRBlock>(this,uVar4);
              uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSVar8->continue_block);
              uVar5 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_2b8);
              if (uVar4 == uVar5) {
                itr_2.
                super__Node_iterator_base<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)6>,_spirv_cross::TypedID<(spirv_cross::Types)6>_>,_true>
                ._M_cur._0_4_ = local_2b8.id;
              }
            }
            uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&itr_2);
            if (uVar4 == 0) {
              __assert_fail("header",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]SPIRV-Cross/spirv_cross.cpp"
                            ,0x1084,
                            "void spirv_cross::Compiler::analyze_variable_scope(SPIRFunction &, AnalyzeVariableScopeAccessHandler &)"
                           );
            }
            uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&itr_2);
            blocks_2 = (mapped_type *)get<spirv_cross::SPIRBlock>(this,uVar4);
            pmVar15 = ::std::
                      unordered_map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
                      ::operator[]((unordered_map<unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
                                    *)&(cfg->preceding_edges)._M_h._M_bucket_count,&__k_00->first);
            pmStack_2e8 = pmVar15;
            local_2f0 = TypedID::operator_cast_to_unsigned_int((TypedID *)&itr_2);
            sVar16 = ::std::
                     unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                     ::count(pmVar15,&local_2f0);
            static_loop_init = sVar16 != 0;
            succ._7_1_ = 1;
            while( true ) {
              uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_2b4);
              uVar5 = TypedID::operator_cast_to_unsigned_int((TypedID *)&itr_2);
              puVar12 = pmStack_2e8;
              if (uVar4 == uVar5) break;
              succ._0_4_ = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_2b4);
              sVar16 = ::std::
                       unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                       ::count(puVar12,(key_type *)&succ);
              pCVar1 = local_28;
              if (sVar16 != 0) {
                static_loop_init = true;
              }
              uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_2b4);
              pred = CFG::get_succeeding_edges(pCVar1,uVar4);
              sVar17 = VectorView<unsigned_int>::size(&pred->super_VectorView<unsigned_int>);
              pCVar1 = local_28;
              if (sVar17 != 1) {
                succ._7_1_ = 0;
                break;
              }
              puVar18 = VectorView<unsigned_int>::front(&pred->super_VectorView<unsigned_int>);
              local_308 = CFG::get_preceding_edges(pCVar1,*puVar18);
              sVar17 = VectorView<unsigned_int>::size(&local_308->super_VectorView<unsigned_int>);
              if (sVar17 != 1) {
LAB_003be6a5:
                succ._7_1_ = 0;
                break;
              }
              puVar18 = VectorView<unsigned_int>::front(&local_308->super_VectorView<unsigned_int>);
              uVar4 = *puVar18;
              uVar5 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_2b4);
              if (uVar4 != uVar5) goto LAB_003be6a5;
              puVar18 = VectorView<unsigned_int>::front(&pred->super_VectorView<unsigned_int>);
              TypedID<(spirv_cross::Types)6>::TypedID(&local_30c,*puVar18);
              local_2b4 = local_30c.id;
            }
            if (((succ._7_1_ & 1) != 0) && ((static_loop_init & 1U) != 0)) {
              ::std::
              unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              ::clear((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                       *)&__range1_3);
              pCVar1 = local_28;
              uVar4 = TypedID::operator_cast_to_unsigned_int
                                ((TypedID *)((long)&(blocks_2->_M_h)._M_element_count + 4));
              local_320.blocks = pmStack_2e8;
              local_320.static_loop_init = (bool *)((long)&succ + 7);
              CFG::
              walk_from<spirv_cross::Compiler::analyze_variable_scope(spirv_cross::SPIRFunction&,spirv_cross::Compiler::AnalyzeVariableScopeAccessHandler&)::__0>
                        (pCVar1,(unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                                 *)&__range1_3,uVar4,&local_320);
              if ((succ._7_1_ & 1) != 0) {
                pmVar15 = blocks_2 + 0xf;
                TypedID<(spirv_cross::Types)2>::TypedID(&local_324,__k_00->first);
                SmallVector<spirv_cross::TypedID<(spirv_cross::Types)2>,_8UL>::push_back
                          ((SmallVector<spirv_cross::TypedID<(spirv_cross::Types)2>,_8UL> *)
                           &(pmVar15->_M_h)._M_element_count,&local_324);
                pTVar19 = ::std::
                          begin<spirv_cross::SmallVector<spirv_cross::TypedID<(spirv_cross::Types)2>,8ul>>
                                    ((SmallVector<spirv_cross::TypedID<(spirv_cross::Types)2>,_8UL>
                                      *)&blocks_2[0xf]._M_h._M_element_count);
                pTVar20 = ::std::
                          end<spirv_cross::SmallVector<spirv_cross::TypedID<(spirv_cross::Types)2>,8ul>>
                                    ((SmallVector<spirv_cross::TypedID<(spirv_cross::Types)2>,_8UL>
                                      *)&blocks_2[0xf]._M_h._M_element_count);
                ::std::sort<spirv_cross::TypedID<(spirv_cross::Types)2>*>(pTVar19,pTVar20);
                pSVar21 = get<spirv_cross::SPIRVariable>(this,__k_00->first);
                pSVar21->loop_variable = true;
              }
            }
          }
        }
        ::std::__detail::_Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>::
        operator++(&__end1_3);
      } while( true );
    }
    __k = ::std::__detail::
          _Node_iterator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>,_false,_false>
          ::operator*(&__end1_1);
    pTVar19 = ::std::
              begin<spirv_cross::SmallVector<spirv_cross::TypedID<(spirv_cross::Types)2>,8ul>>
                        ((SmallVector<spirv_cross::TypedID<(spirv_cross::Types)2>,_8UL> *)
                         &(handler_local->rvalue_forward_children)._M_h._M_rehash_policy);
    pTVar20 = ::std::end<spirv_cross::SmallVector<spirv_cross::TypedID<(spirv_cross::Types)2>,8ul>>
                        ((SmallVector<spirv_cross::TypedID<(spirv_cross::Types)2>,_8UL> *)
                         &(handler_local->rvalue_forward_children)._M_h._M_rehash_policy);
    TypedID<(spirv_cross::Types)2>::TypedID
              ((TypedID<(spirv_cross::Types)2> *)&builder.field_0xc,__k->first);
    pTVar19 = ::std::
              find<spirv_cross::TypedID<(spirv_cross::Types)2>*,spirv_cross::TypedID<(spirv_cross::Types)2>>
                        (pTVar19,pTVar20,(TypedID<(spirv_cross::Types)2> *)&builder.field_0xc);
    pTVar20 = ::std::end<spirv_cross::SmallVector<spirv_cross::TypedID<(spirv_cross::Types)2>,8ul>>
                        ((SmallVector<spirv_cross::TypedID<(spirv_cross::Types)2>,_8UL> *)
                         &(handler_local->rvalue_forward_children)._M_h._M_rehash_policy);
    if (pTVar19 != pTVar20) {
      DominatorBuilder::DominatorBuilder((DominatorBuilder *)&blocks,local_28);
      pSStack_110 = expression_type(this,__k->first);
      TypedID<(spirv_cross::Types)6>::TypedID
                ((TypedID<(spirv_cross::Types)6> *)((long)&__range2 + 4),0);
      __end2 = ::std::
               unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
               ::begin(&__k->second);
      block_1 = (uint *)::std::
                        unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                        ::end(&__k->second);
      while (bVar22 = ::std::__detail::operator!=
                                (&__end2.super__Node_iterator_base<unsigned_int,_false>,
                                 (_Node_iterator_base<unsigned_int,_false> *)&block_1), bVar22) {
        local_138 = ::std::__detail::_Node_iterator<unsigned_int,_true,_false>::operator*(&__end2);
        bVar22 = is_continue(this,*local_138);
        if (bVar22) {
          TypedID<(spirv_cross::Types)6>::TypedID(&local_13c,*local_138);
          pTVar13 = (TypedID *)
                    ::std::
                    unordered_map<spirv_cross::TypedID<(spirv_cross::Types)6>,_spirv_cross::TypedID<(spirv_cross::Types)6>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)6>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)6>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)6>,_spirv_cross::TypedID<(spirv_cross::Types)6>_>_>_>
                    ::operator[](&(this->ir).continue_block_to_loop_header,&local_13c);
          uVar4 = TypedID::operator_cast_to_unsigned_int(pTVar13);
          DominatorBuilder::add_block((DominatorBuilder *)&blocks,uVar4);
          if ((((pSStack_110->vecsize == 1) && (pSStack_110->columns == 1)) &&
              (pSStack_110->basetype != Struct)) &&
             (bVar22 = VectorView<unsigned_int>::empty
                                 (&(pSStack_110->array).super_VectorView<unsigned_int>), bVar22)) {
            uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&__range2 + 4));
            if (uVar4 == 0) {
              TypedID<(spirv_cross::Types)6>::TypedID(&dominating_block,*local_138);
              __range2._4_4_ = dominating_block.id;
            }
            else {
              TypedID<(spirv_cross::Types)6>::TypedID
                        ((TypedID<(spirv_cross::Types)6> *)((long)&inner_block + 4),0xffffffff);
              __range2._4_4_ = inner_block._4_4_;
            }
          }
        }
        DominatorBuilder::add_block((DominatorBuilder *)&blocks,*local_138);
        ::std::__detail::_Node_iterator<unsigned_int,_true,_false>::operator++(&__end2);
      }
      DominatorBuilder::lift_continue_block_dominator((DominatorBuilder *)&blocks);
      uVar4 = DominatorBuilder::get_dominator((DominatorBuilder *)&blocks);
      TypedID<(spirv_cross::Types)6>::TypedID((TypedID<(spirv_cross::Types)6> *)&inner_block,uVar4);
      uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&inner_block);
      if (((uVar4 != 0) &&
          (uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&__range2 + 4)),
          uVar4 != 0)) &&
         (uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&__range2 + 4)),
         uVar4 != 0xffffffff)) {
        uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&inner_block);
        pSStack_150 = get<spirv_cross::SPIRBlock>(this,uVar4);
        TypedID<(spirv_cross::Types)6>::TypedID
                  ((TypedID<(spirv_cross::Types)6> *)((long)&variable + 4),0);
        if (pSStack_150->merge == MergeLoop) {
          variable._4_4_ = (pSStack_150->merge_block).id;
        }
        else {
          uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSStack_150->loop_dominator);
          if (uVar4 != 0xffffffff) {
            uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSStack_150->loop_dominator);
            pSVar8 = get<spirv_cross::SPIRBlock>(this,uVar4);
            variable._4_4_ = (pSVar8->merge_block).id;
          }
        }
        uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&variable + 4));
        pCVar1 = local_28;
        if (uVar4 != 0) {
          uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&variable + 4));
          bVar22 = CFG::is_reachable(pCVar1,uVar4);
          pCVar1 = local_28;
          if (bVar22) {
            uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&__range2 + 4));
            bVar22 = CFG::is_reachable(pCVar1,uVar4);
            pCVar1 = local_28;
            if (bVar22) {
              uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&variable + 4));
              uVar4 = CFG::get_visit_order(pCVar1,uVar4);
              pCVar1 = local_28;
              uVar5 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&__range2 + 4));
              uVar5 = CFG::get_visit_order(pCVar1,uVar5);
              if (uVar4 <= uVar5) goto LAB_003bd78b;
            }
            TypedID<(spirv_cross::Types)6>::TypedID((TypedID<(spirv_cross::Types)6> *)&variable,0);
            __range2._4_4_ = (uint32_t)variable;
          }
        }
      }
LAB_003bd78b:
      uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&__range2 + 4));
      if ((uVar4 != 0) &&
         (uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&__range2 + 4)),
         uVar4 != 0xffffffff)) {
        uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&__range2 + 4));
        pmVar14 = ::std::
                  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                  ::operator[]((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                *)&__range1,&__k->first);
        *pmVar14 = uVar4;
      }
      uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&inner_block);
      if ((uVar4 != 0) &&
         (block_2 = (SPIRBlock *)get<spirv_cross::SPIRVariable>(this,__k->first),
         ((block_2->ops).stack_storage.aligned_char[0x39] & 1U) == 0)) {
        uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&inner_block);
        pSStack_168 = get<spirv_cross::SPIRBlock>(this,uVar4);
        local_169 = may_read_undefined_variable_in_block(this,pSStack_168,__k->first);
        if ((bool)local_169) {
          while( true ) {
            uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSStack_168->loop_dominator);
            TypedID<(spirv_cross::Types)6>::TypedID(&local_170,0xffffffff);
            uVar5 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_170);
            if (uVar4 == uVar5) break;
            uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSStack_168->loop_dominator);
            pSStack_168 = get<spirv_cross::SPIRBlock>(this,uVar4);
          }
          uVar4 = TypedID::operator_cast_to_unsigned_int
                            ((TypedID *)&(pSStack_168->super_IVariant).self);
          uVar5 = TypedID::operator_cast_to_unsigned_int((TypedID *)&inner_block);
          if (uVar4 != uVar5) {
            uVar4 = TypedID::operator_cast_to_unsigned_int
                              ((TypedID *)&(pSStack_168->super_IVariant).self);
            DominatorBuilder::add_block((DominatorBuilder *)&blocks,uVar4);
            uVar4 = DominatorBuilder::get_dominator((DominatorBuilder *)&blocks);
            TypedID<(spirv_cross::Types)6>::TypedID
                      ((TypedID<(spirv_cross::Types)6> *)((long)&block_3 + 4),uVar4);
            inner_block._0_4_ = block_3._4_4_;
          }
        }
      }
      uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&inner_block);
      if (uVar4 != 0) {
        uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&inner_block);
        local_180 = get<spirv_cross::SPIRBlock>(this,uVar4);
        this_01 = &local_180->dominated_variables;
        TypedID<(spirv_cross::Types)2>::TypedID
                  ((TypedID<(spirv_cross::Types)2> *)((long)&__range1_2 + 4),__k->first);
        SmallVector<spirv_cross::TypedID<(spirv_cross::Types)2>,_8UL>::push_back
                  (this_01,(TypedID<(spirv_cross::Types)2> *)((long)&__range1_2 + 4));
        pSVar21 = get<spirv_cross::SPIRVariable>(this,__k->first);
        (pSVar21->dominator).id = (uint32_t)inner_block;
      }
    }
    ::std::__detail::
    _Node_iterator<std::pair<const_unsigned_int,_std::unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>_>,_false,_false>
    ::operator++(&__end1_1);
  } while( true );
}

Assistant:

void Compiler::analyze_variable_scope(SPIRFunction &entry, AnalyzeVariableScopeAccessHandler &handler)
{
	// First, we map out all variable access within a function.
	// Essentially a map of block -> { variables accessed in the basic block }
	traverse_all_reachable_opcodes(entry, handler);

	auto &cfg = *function_cfgs.find(entry.self)->second;

	// Analyze if there are parameters which need to be implicitly preserved with an "in" qualifier.
	analyze_parameter_preservation(entry, cfg, handler.accessed_variables_to_block,
	                               handler.complete_write_variables_to_block);

	unordered_map<uint32_t, uint32_t> potential_loop_variables;

	// Find the loop dominator block for each block.
	for (auto &block_id : entry.blocks)
	{
		auto &block = get<SPIRBlock>(block_id);

		auto itr = ir.continue_block_to_loop_header.find(block_id);
		if (itr != end(ir.continue_block_to_loop_header) && itr->second != block_id)
		{
			// Continue block might be unreachable in the CFG, but we still like to know the loop dominator.
			// Edge case is when continue block is also the loop header, don't set the dominator in this case.
			block.loop_dominator = itr->second;
		}
		else
		{
			uint32_t loop_dominator = cfg.find_loop_dominator(block_id);
			if (loop_dominator != block_id)
				block.loop_dominator = loop_dominator;
			else
				block.loop_dominator = SPIRBlock::NoDominator;
		}
	}

	// For each variable which is statically accessed.
	for (auto &var : handler.accessed_variables_to_block)
	{
		// Only deal with variables which are considered local variables in this function.
		if (find(begin(entry.local_variables), end(entry.local_variables), VariableID(var.first)) ==
		    end(entry.local_variables))
			continue;

		DominatorBuilder builder(cfg);
		auto &blocks = var.second;
		auto &type = expression_type(var.first);
		BlockID potential_continue_block = 0;

		// Figure out which block is dominating all accesses of those variables.
		for (auto &block : blocks)
		{
			// If we're accessing a variable inside a continue block, this variable might be a loop variable.
			// We can only use loop variables with scalars, as we cannot track static expressions for vectors.
			if (is_continue(block))
			{
				// Potentially awkward case to check for.
				// We might have a variable inside a loop, which is touched by the continue block,
				// but is not actually a loop variable.
				// The continue block is dominated by the inner part of the loop, which does not make sense in high-level
				// language output because it will be declared before the body,
				// so we will have to lift the dominator up to the relevant loop header instead.
				builder.add_block(ir.continue_block_to_loop_header[block]);

				// Arrays or structs cannot be loop variables.
				if (type.vecsize == 1 && type.columns == 1 && type.basetype != SPIRType::Struct && type.array.empty())
				{
					// The variable is used in multiple continue blocks, this is not a loop
					// candidate, signal that by setting block to -1u.
					if (potential_continue_block == 0)
						potential_continue_block = block;
					else
						potential_continue_block = ~(0u);
				}
			}

			builder.add_block(block);
		}

		builder.lift_continue_block_dominator();

		// Add it to a per-block list of variables.
		BlockID dominating_block = builder.get_dominator();

		if (dominating_block && potential_continue_block != 0 && potential_continue_block != ~0u)
		{
			auto &inner_block = get<SPIRBlock>(dominating_block);

			BlockID merge_candidate = 0;

			// Analyze the dominator. If it lives in a different loop scope than the candidate continue
			// block, reject the loop variable candidate.
			if (inner_block.merge == SPIRBlock::MergeLoop)
				merge_candidate = inner_block.merge_block;
			else if (inner_block.loop_dominator != SPIRBlock::NoDominator)
				merge_candidate = get<SPIRBlock>(inner_block.loop_dominator).merge_block;

			if (merge_candidate != 0 && cfg.is_reachable(merge_candidate))
			{
				// If the merge block has a higher post-visit order, we know that continue candidate
				// cannot reach the merge block, and we have two separate scopes.
				if (!cfg.is_reachable(potential_continue_block) ||
				    cfg.get_visit_order(merge_candidate) > cfg.get_visit_order(potential_continue_block))
				{
					potential_continue_block = 0;
				}
			}
		}

		if (potential_continue_block != 0 && potential_continue_block != ~0u)
			potential_loop_variables[var.first] = potential_continue_block;

		// For variables whose dominating block is inside a loop, there is a risk that these variables
		// actually need to be preserved across loop iterations. We can express this by adding
		// a "read" access to the loop header.
		// In the dominating block, we must see an OpStore or equivalent as the first access of an OpVariable.
		// Should that fail, we look for the outermost loop header and tack on an access there.
		// Phi nodes cannot have this problem.
		if (dominating_block)
		{
			auto &variable = get<SPIRVariable>(var.first);
			if (!variable.phi_variable)
			{
				auto *block = &get<SPIRBlock>(dominating_block);
				bool preserve = may_read_undefined_variable_in_block(*block, var.first);
				if (preserve)
				{
					// Find the outermost loop scope.
					while (block->loop_dominator != BlockID(SPIRBlock::NoDominator))
						block = &get<SPIRBlock>(block->loop_dominator);

					if (block->self != dominating_block)
					{
						builder.add_block(block->self);
						dominating_block = builder.get_dominator();
					}
				}
			}
		}

		// If all blocks here are dead code, this will be 0, so the variable in question
		// will be completely eliminated.
		if (dominating_block)
		{
			auto &block = get<SPIRBlock>(dominating_block);
			block.dominated_variables.push_back(var.first);
			get<SPIRVariable>(var.first).dominator = dominating_block;
		}
	}

	for (auto &var : handler.accessed_temporaries_to_block)
	{
		auto itr = handler.result_id_to_type.find(var.first);

		if (itr == end(handler.result_id_to_type))
		{
			// We found a false positive ID being used, ignore.
			// This should probably be an assert.
			continue;
		}

		// There is no point in doing domination analysis for opaque types.
		auto &type = get<SPIRType>(itr->second);
		if (type_is_opaque_value(type))
			continue;

		DominatorBuilder builder(cfg);
		bool force_temporary = false;
		bool used_in_header_hoisted_continue_block = false;

		// Figure out which block is dominating all accesses of those temporaries.
		auto &blocks = var.second;
		for (auto &block : blocks)
		{
			builder.add_block(block);

			if (blocks.size() != 1 && is_continue(block))
			{
				// The risk here is that inner loop can dominate the continue block.
				// Any temporary we access in the continue block must be declared before the loop.
				// This is moot for complex loops however.
				auto &loop_header_block = get<SPIRBlock>(ir.continue_block_to_loop_header[block]);
				assert(loop_header_block.merge == SPIRBlock::MergeLoop);
				builder.add_block(loop_header_block.self);
				used_in_header_hoisted_continue_block = true;
			}
		}

		uint32_t dominating_block = builder.get_dominator();

		if (blocks.size() != 1 && is_single_block_loop(dominating_block))
		{
			// Awkward case, because the loop header is also the continue block,
			// so hoisting to loop header does not help.
			force_temporary = true;
		}

		if (dominating_block)
		{
			// If we touch a variable in the dominating block, this is the expected setup.
			// SPIR-V normally mandates this, but we have extra cases for temporary use inside loops.
			bool first_use_is_dominator = blocks.count(dominating_block) != 0;

			if (!first_use_is_dominator || force_temporary)
			{
				if (handler.access_chain_expressions.count(var.first))
				{
					// Exceptionally rare case.
					// We cannot declare temporaries of access chains (except on MSL perhaps with pointers).
					// Rather than do that, we force the indexing expressions to be declared in the right scope by
					// tracking their usage to that end. There is no temporary to hoist.
					// However, we still need to observe declaration order of the access chain.

					if (used_in_header_hoisted_continue_block)
					{
						// For this scenario, we used an access chain inside a continue block where we also registered an access to header block.
						// This is a problem as we need to declare an access chain properly first with full definition.
						// We cannot use temporaries for these expressions,
						// so we must make sure the access chain is declared ahead of time.
						// Force a complex for loop to deal with this.
						// TODO: Out-of-order declaring for loops where continue blocks are emitted last might be another option.
						auto &loop_header_block = get<SPIRBlock>(dominating_block);
						assert(loop_header_block.merge == SPIRBlock::MergeLoop);
						loop_header_block.complex_continue = true;
					}
				}
				else
				{
					// This should be very rare, but if we try to declare a temporary inside a loop,
					// and that temporary is used outside the loop as well (spirv-opt inliner likes this)
					// we should actually emit the temporary outside the loop.
					hoisted_temporaries.insert(var.first);
					forced_temporaries.insert(var.first);

					auto &block_temporaries = get<SPIRBlock>(dominating_block).declare_temporary;
					block_temporaries.emplace_back(handler.result_id_to_type[var.first], var.first);
				}
			}
			else if (blocks.size() > 1)
			{
				// Keep track of the temporary as we might have to declare this temporary.
				// This can happen if the loop header dominates a temporary, but we have a complex fallback loop.
				// In this case, the header is actually inside the for (;;) {} block, and we have problems.
				// What we need to do is hoist the temporaries outside the for (;;) {} block in case the header block
				// declares the temporary.
				auto &block_temporaries = get<SPIRBlock>(dominating_block).potential_declare_temporary;
				block_temporaries.emplace_back(handler.result_id_to_type[var.first], var.first);
			}
		}
	}

	unordered_set<uint32_t> seen_blocks;

	// Now, try to analyze whether or not these variables are actually loop variables.
	for (auto &loop_variable : potential_loop_variables)
	{
		auto &var = get<SPIRVariable>(loop_variable.first);
		auto dominator = var.dominator;
		BlockID block = loop_variable.second;

		// The variable was accessed in multiple continue blocks, ignore.
		if (block == BlockID(~(0u)) || block == BlockID(0))
			continue;

		// Dead code.
		if (dominator == ID(0))
			continue;

		BlockID header = 0;

		// Find the loop header for this block if we are a continue block.
		{
			auto itr = ir.continue_block_to_loop_header.find(block);
			if (itr != end(ir.continue_block_to_loop_header))
			{
				header = itr->second;
			}
			else if (get<SPIRBlock>(block).continue_block == block)
			{
				// Also check for self-referential continue block.
				header = block;
			}
		}

		assert(header);
		auto &header_block = get<SPIRBlock>(header);
		auto &blocks = handler.accessed_variables_to_block[loop_variable.first];

		// If a loop variable is not used before the loop, it's probably not a loop variable.
		bool has_accessed_variable = blocks.count(header) != 0;

		// Now, there are two conditions we need to meet for the variable to be a loop variable.
		// 1. The dominating block must have a branch-free path to the loop header,
		// this way we statically know which expression should be part of the loop variable initializer.

		// Walk from the dominator, if there is one straight edge connecting
		// dominator and loop header, we statically know the loop initializer.
		bool static_loop_init = true;
		while (dominator != header)
		{
			if (blocks.count(dominator) != 0)
				has_accessed_variable = true;

			auto &succ = cfg.get_succeeding_edges(dominator);
			if (succ.size() != 1)
			{
				static_loop_init = false;
				break;
			}

			auto &pred = cfg.get_preceding_edges(succ.front());
			if (pred.size() != 1 || pred.front() != dominator)
			{
				static_loop_init = false;
				break;
			}

			dominator = succ.front();
		}

		if (!static_loop_init || !has_accessed_variable)
			continue;

		// The second condition we need to meet is that no access after the loop
		// merge can occur. Walk the CFG to see if we find anything.

		seen_blocks.clear();
		cfg.walk_from(seen_blocks, header_block.merge_block, [&](uint32_t walk_block) -> bool {
			// We found a block which accesses the variable outside the loop.
			if (blocks.find(walk_block) != end(blocks))
				static_loop_init = false;
			return true;
		});

		if (!static_loop_init)
			continue;

		// We have a loop variable.
		header_block.loop_variables.push_back(loop_variable.first);
		// Need to sort here as variables come from an unordered container, and pushing stuff in wrong order
		// will break reproducability in regression runs.
		sort(begin(header_block.loop_variables), end(header_block.loop_variables));
		get<SPIRVariable>(loop_variable.first).loop_variable = true;
	}
}